

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O3

void njd_set_unvoiced_vowel(NJD *njd)

{
  NJDNode *node;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  NJDNode *pNVar7;
  int index;
  char *pcVar8;
  int local_4bc;
  int flag1;
  int atype2;
  int midx2;
  int size1;
  int atype1;
  int midx1;
  int flag3;
  int size2;
  char *local_498;
  int local_490;
  int local_48c;
  int local_488;
  int size3;
  NJDNode *nlink2;
  NJDNode *nlink3;
  NJDNode *nlink1;
  char *local_468;
  char *mora3;
  char *mora2;
  char *mora1;
  NJDNode *local_448;
  size_t local_440;
  char buff [1024];
  
  mora1 = (char *)0x0;
  mora2 = (char *)0x0;
  mora3 = (char *)0x0;
  nlink1 = (NJDNode *)0x0;
  nlink2 = (NJDNode *)0x0;
  nlink3 = (NJDNode *)0x0;
  size1 = 0;
  size2 = 0;
  size3 = 0;
  flag1 = -1;
  local_4bc = -1;
  flag3 = -1;
  midx1 = 0;
  midx2 = 1;
  atype1 = 0;
  atype2 = 0;
  pNVar7 = njd->head;
  if (pNVar7 != (NJDNode *)0x0) {
    pcVar5 = (char *)0x0;
    pcVar8 = (char *)0x0;
    do {
      buff[0] = '\0';
      pcVar4 = NJDNode_get_pron(pNVar7);
      local_440 = strlen(pcVar4);
      if (0 < (int)local_440) {
        index = 0;
        local_448 = pNVar7;
        do {
          pNVar7 = local_448;
          local_498 = pcVar8;
          if (pcVar8 == (char *)0x0) {
            get_mora_information(local_448,index,&mora1,&nlink1,&flag1,&size1,&midx1,&atype1);
            local_498 = mora1;
            if (mora1 == (char *)0x0) {
              njd_set_unvoiced_vowel_cold_1();
              return;
            }
          }
          if (pcVar5 == (char *)0x0) {
            midx2 = midx1 + 1;
            atype2 = atype1;
            get_mora_information
                      (pNVar7,size1 + index,&mora2,&nlink2,&local_4bc,&size2,&midx2,&atype2);
          }
          local_488 = midx2 + 1;
          local_48c = atype2;
          get_mora_information
                    (pNVar7,size1 + index + size2,&mora3,&nlink3,&flag3,&size3,&local_488,&local_48c
                    );
          pcVar8 = mora2;
          pcVar5 = mora3;
          node = nlink3;
          pNVar7 = nlink2;
          if ((((mora3 != (char *)0x0 && mora2 != (char *)0x0) &&
               (nlink2 != nlink3 && nlink1 == nlink2)) &&
              ((iVar1 = strcmp(local_498,anon_var_dwarf_134aaa + 3), iVar1 == 0 ||
               (iVar1 = strcmp(local_498,anon_var_dwarf_12e198), iVar1 == 0)))) &&
             (iVar1 = strcmp(pcVar8,anon_var_dwarf_13881e + 0xc), iVar1 == 0)) {
            pcVar4 = NJDNode_get_pos(pNVar7);
            iVar1 = strcmp(pcVar4,anon_var_dwarf_1372ad + 3);
            if (iVar1 != 0) {
              pcVar4 = NJDNode_get_pos(pNVar7);
              iVar1 = strcmp(pcVar4,anon_var_dwarf_138876 + 6);
              if (iVar1 != 0) {
                pcVar4 = NJDNode_get_pos(pNVar7);
                iVar1 = strcmp(pcVar4,anon_var_dwarf_1372ad);
                if (iVar1 != 0) goto LAB_00172569;
              }
            }
            pcVar4 = NJDNode_get_pron(node);
            iVar1 = strcmp(pcVar4,anon_var_dwarf_9a4 + 0x12);
            if (iVar1 != 0) {
              pcVar4 = NJDNode_get_pron(node);
              iVar1 = strcmp(pcVar4,anon_var_dwarf_13444c + 6);
              if (iVar1 != 0) {
                local_4bc = 1;
                goto LAB_00172569;
              }
            }
            local_4bc = 0;
          }
LAB_00172569:
          pNVar7 = nlink2;
          iVar3 = flag1;
          local_468 = pcVar5;
          local_490 = flag3;
          iVar1 = local_4bc;
          if ((((pcVar8 == (char *)0x0) || (flag1 == 1)) || (local_4bc != -1)) || (flag3 == 1)) {
LAB_001725c1:
            pcVar5 = local_468;
            if (iVar3 != -1) {
LAB_001725ce:
              if ((iVar3 != 1) || (iVar1 != -1)) {
                strcat(buff,local_498);
                goto joined_r0x0017264d;
              }
              local_4bc = 0;
              strcat(buff,local_498);
              iVar1 = 0;
              goto LAB_0017264f;
            }
            pcVar4 = NJDNode_get_pos(nlink1);
            iVar3 = strcmp(pcVar4,anon_var_dwarf_131407);
            if (((iVar3 != 0) && (iVar1 != 1)) && (atype1 != midx1 + 1)) {
              iVar3 = apply_unvoice_rule(local_498,pcVar8);
              flag1 = iVar3;
              goto LAB_001725ce;
            }
            flag1 = 0;
            strcat(buff,local_498);
          }
          else {
            pcVar5 = NJDNode_get_pron(nlink2);
            iVar2 = strcmp(pcVar5,anon_var_dwarf_13888c + 0xf);
            iVar1 = -1;
            if (iVar2 != 0) goto LAB_001725c1;
            pcVar5 = NJDNode_get_pos(pNVar7);
            iVar2 = strcmp(pcVar5,anon_var_dwarf_1372ad + 3);
            if (iVar2 != 0) {
              pcVar5 = NJDNode_get_pos(pNVar7);
              iVar2 = strcmp(pcVar5,anon_var_dwarf_138876 + 6);
              if (iVar2 != 0) {
                pcVar5 = NJDNode_get_pos(pNVar7);
                iVar2 = strcmp(pcVar5,anon_var_dwarf_13839d + 10);
                if (iVar2 != 0) goto LAB_001725c1;
              }
            }
            if (atype2 == midx2 + 1) {
              local_4bc = 0;
              iVar1 = 0;
              goto LAB_001725c1;
            }
            iVar1 = apply_unvoice_rule(pcVar8,local_468);
            local_4bc = iVar1;
            if (iVar1 != 1) goto LAB_001725c1;
            if (iVar3 == -1) {
              flag1 = 0;
              iVar3 = 0;
            }
            if (local_490 == -1) {
              flag3 = 0;
              local_490 = 0;
            }
            strcat(buff,local_498);
            iVar1 = 1;
            pcVar5 = local_468;
joined_r0x0017264d:
            if (iVar3 == 1) {
LAB_0017264f:
              sVar6 = strlen(buff);
              builtin_strncpy(buff + sVar6,"’",4);
            }
          }
          index = index + size1;
          mora1 = pcVar8;
          nlink1 = nlink2;
          size1 = size2;
          midx1 = midx2;
          atype1 = atype2;
          nlink2 = nlink3;
          size2 = size3;
          local_4bc = local_490;
          midx2 = local_488;
          atype2 = local_48c;
          mora3 = (char *)0x0;
          nlink3 = (NJDNode *)0x0;
          size3 = 0;
          flag3 = -1;
          local_488 = 0;
          local_48c = 0;
          pNVar7 = local_448;
          flag1 = iVar1;
          mora2 = pcVar5;
        } while (index < (int)local_440);
      }
      NJDNode_set_pron(pNVar7,buff);
      pNVar7 = pNVar7->next;
    } while (pNVar7 != (NJDNode *)0x0);
  }
  return;
}

Assistant:

void njd_set_unvoiced_vowel(NJD * njd)
{
   NJDNode *node;
   int index;
   int len;
   char buff[MAXBUFLEN];
   const char *str;

   /* mora information for current, next, and next-next moras */
   const char *mora1 = NULL, *mora2 = NULL, *mora3 = NULL;
   NJDNode *nlink1 = NULL, *nlink2 = NULL, *nlink3 = NULL;
   int size1 = 0, size2 = 0, size3 = 0;
   int flag1 = -1, flag2 = -1, flag3 = -1;      /* unknown:-1, voice:0, unvoiced:1 */
   int midx1 = 0, midx2 = 1, midx3 = 2;
   int atype1 = 0, atype2 = 0, atype3 = 0;

   for (node = njd->head; node != NULL; node = node->next) {
      buff[0] = '\0';

      /* get pronunciation */
      str = NJDNode_get_pron(node);
      len = strlen(str);

      /* parse pronunciation */
      for (index = 0; index < len;) {
         /* get mora information */
         if (mora1 == NULL)
            get_mora_information(node, index, &mora1, &nlink1, &flag1, &size1, &midx1, &atype1);
         if (mora1 == NULL) {
            fprintf(stderr,
                    "WARNING: set_unvoiced_vowel() in njd_set_unvoiced_vowel.c: Wrong pron.");
            return;
         }
         if (mora2 == NULL) {
            midx2 = midx1 + 1;
            atype2 = atype1;
            get_mora_information(node, index + size1, &mora2, &nlink2, &flag2, &size2, &midx2,
                                 &atype2);
         }
         if (mora3 == NULL) {
            midx3 = midx2 + 1;
            atype3 = atype2;
            get_mora_information(node, index + size1 + size2, &mora3, &nlink3, &flag3, &size3,
                                 &midx3, &atype3);
         }

         /* rule 1: look-ahead for 'masu' and 'desu' */
         if (mora2 != NULL && mora3 != NULL && nlink1 == nlink2 && nlink2 != nlink3 &&
             (strcmp(mora1, NJD_SET_UNVOICED_VOWEL_MA) == 0
              || strcmp(mora1, NJD_SET_UNVOICED_VOWEL_DE) == 0)
             && strcmp(mora2, NJD_SET_UNVOICED_VOWEL_SU) == 0
             && (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_KANDOUSHI) == 0)
             ) {
            if (strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_QUESTION) == 0
                || strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_CHOUON) == 0)
               flag2 = 0;
            else
               flag2 = 1;
         }

         /* rule 2: look-ahead for 'shi' */
         if (flag1 != 1 && flag2 == -1 && flag3 != 1 && mora2 != NULL &&
             strcmp(NJDNode_get_pron(nlink2), NJD_SET_UNVOICED_VOWEL_SHI) == 0 &&
             (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JOSHI) == 0)) {
            if (atype2 == midx2 + 1) {
               /* rule 4 */
               flag2 = 0;
            } else {
               /* rule 5 */
               flag2 = apply_unvoice_rule(mora2, mora3);
            }
            if (flag2 == 1) {
               if (flag1 == -1)
                  flag1 = 0;
               if (flag3 == -1)
                  flag3 = 0;
            }
         }

         /* estimate unvoice */
         if (flag1 == -1) {
            if (strcmp(NJDNode_get_pos(nlink1), NJD_SET_UNVOICED_VOWEL_FILLER) == 0) {
               /* rule 0 */
               flag1 = 0;
            } else if (flag2 == 1) {
               /* rule 3 */
               flag1 = 0;
            } else if (atype1 == midx1 + 1) {
               /* rule 4 */
               flag1 = 0;
            } else {
               /* rule 5 */
               flag1 = apply_unvoice_rule(mora1, mora2);
            }
         }
         if (flag1 == 1 && flag2 == -1) {
            flag2 = 0;
         }

         /* store pronunciation */
         strcat(buff, mora1);
         if (flag1 == 1)
            strcat(buff, NJD_SET_UNVOICED_VOWEL_QUOTATION);

         /* prepare next step */
         index += size1;

         mora1 = mora2;
         nlink1 = nlink2;
         size1 = size2;
         flag1 = flag2;
         midx1 = midx2;
         atype1 = atype2;

         mora2 = mora3;
         nlink2 = nlink3;
         size2 = size3;
         flag2 = flag3;
         midx2 = midx3;
         atype2 = atype3;

         mora3 = NULL;
         nlink3 = NULL;
         size3 = 0;
         flag3 = -1;
         midx3 = 0;
         atype3 = 0;
      }

      NJDNode_set_pron(node, buff);
   }
}